

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcreateapproxspace.cpp
# Opt level: O0

void TPZCreateApproximationSpace::CreateInterfaces(TPZCompMesh *cmesh)

{
  TPZAdmChunkVector<TPZCompEl_*,_10> *this;
  int64_t iVar1;
  TPZCompEl **ppTVar2;
  TPZCompMesh *in_RDI;
  TPZInterpolationSpace *interpEl;
  TPZCompEl *compEl;
  int64_t el;
  undefined1 in_stack_000001ff;
  TPZInterpolationSpace *in_stack_00000200;
  long local_38;
  TPZCompEl *in_stack_ffffffffffffffe8;
  TPZChunkVector<TPZCompEl_*,_10> *pTVar3;
  TPZChunkVector<TPZCompEl_*,_10> *this_00;
  
  pTVar3 = (TPZChunkVector<TPZCompEl_*,_10> *)0x0;
  while( true ) {
    this_00 = pTVar3;
    this = TPZCompMesh::ElementVec(in_RDI);
    iVar1 = TPZChunkVector<TPZCompEl_*,_10>::NElements(&this->super_TPZChunkVector<TPZCompEl_*,_10>)
    ;
    if (iVar1 <= (long)pTVar3) break;
    TPZCompMesh::ElementVec(in_RDI);
    ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (this_00,(int64_t)in_stack_ffffffffffffffe8);
    in_stack_ffffffffffffffe8 = *ppTVar2;
    if (in_stack_ffffffffffffffe8 != (TPZCompEl *)0x0) {
      if (in_stack_ffffffffffffffe8 == (TPZCompEl *)0x0) {
        local_38 = 0;
      }
      else {
        local_38 = __dynamic_cast(in_stack_ffffffffffffffe8,&TPZCompEl::typeinfo,
                                  &TPZInterpolationSpace::typeinfo,0);
      }
      if (local_38 != 0) {
        TPZInterpolationSpace::CreateInterfaces(in_stack_00000200,(bool)in_stack_000001ff);
      }
    }
    pTVar3 = (TPZChunkVector<TPZCompEl_*,_10> *)
             ((long)&(this_00->super_TPZSavable)._vptr_TPZSavable + 1);
  }
  return;
}

Assistant:

void TPZCreateApproximationSpace::CreateInterfaces(TPZCompMesh &cmesh){
    for(int64_t el = 0; el < cmesh.ElementVec().NElements(); el++)
	{
		TPZCompEl * compEl = cmesh.ElementVec()[el];
		if(!compEl) continue;
        
        TPZInterpolationSpace * interpEl = dynamic_cast<TPZInterpolationSpace *>(compEl);
        if(!interpEl) continue;
        interpEl->CreateInterfaces();
    }
    
}